

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

int objuok(objucxdef *undoctx)

{
  ushort prv;
  objucxdef *undoctx_local;
  int local_4;
  
  if (undoctx->objucxprv == undoctx->objucxhead) {
    local_4 = 0;
  }
  else {
    for (prv = undoctx->objucxprv; undoctx->objucxbuf[prv] != '\x03';
        prv = *(ushort *)(undoctx->objucxbuf + (int)(prv + 1))) {
      if (prv == undoctx->objucxtail) {
        return 0;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int objuok(objucxdef *undoctx)
{
    ushort prv;

    /* see if there's any more undo information */
    if (undoctx->objucxprv == undoctx->objucxhead)
        return(FALSE);

    /* look for most recent savepoint marker */
    for (prv = undoctx->objucxprv ;; )
    {
        if (undoctx->objucxbuf[prv] == OBJUSAV)
            return(TRUE);               /* found a savepoint - can add undo */

        /* if we've reached the tail, there are no more undo records */
        if (prv == undoctx->objucxtail)
            return(FALSE);                /* no savepoints - can't add undo */

        /* get previous record */
        memcpy(&prv, &undoctx->objucxbuf[prv+1], sizeof(prv));
    }
}